

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O3

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CMethod *stm)

{
  undefined8 uVar1;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  initializer_list<INode_*> __l;
  ChildrenAnswers answers;
  vector<INode_*,_std::allocator<INode_*>_> children;
  allocator_type local_f1;
  vector<INode_*,_std::allocator<INode_*>_> local_f0;
  string local_d8;
  string local_b8;
  undefined1 local_98 [24];
  vector<int,_std::allocator<int>_> local_80;
  ChildrenAnswers local_60;
  vector<INode_*,_std::allocator<INode_*>_> local_30;
  
  local_98._0_8_ =
       (stm->returnType)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
       super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
       super__Head_base<0UL,_CType_*,_false>._M_head_impl;
  local_98._8_8_ =
       (stm->returnExp)._M_t.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>.
       _M_t.super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
       super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  local_98._16_8_ =
       (stm->arguments)._M_t.
       super___uniq_ptr_impl<CArgumentList,_std::default_delete<CArgumentList>_>._M_t.
       super__Tuple_impl<0UL,_CArgumentList_*,_std::default_delete<CArgumentList>_>.
       super__Head_base<0UL,_CArgumentList_*,_false>._M_head_impl;
  uVar1 = stm->statements;
  uVar2 = stm->vars;
  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (int)uVar1;
  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)uVar2;
  local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (int)((ulong)uVar1 >> 0x20);
  __l._M_len = 5;
  __l._M_array = (iterator)local_98;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector(&local_30,__l,&local_f1);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector(&local_f0,&local_30);
  VisitChildren((ChildrenAnswers *)local_98,this,&local_f0);
  if (local_f0.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_60.descriptions,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_98);
  std::vector<int,_std::allocator<int>_>::vector(&local_60.ids,&local_80);
  AddChildrenAnswers(this,&local_60);
  if (local_60.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60.descriptions);
  if (stm->isPublic == true) {
    paVar4 = &local_b8.field_2;
    local_b8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"PublicMethod","");
    AddLabel(this,&local_b8);
    _Var3._M_p = local_b8._M_dataplus._M_p;
  }
  else {
    paVar4 = &local_d8.field_2;
    local_d8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"PrivateMethod","");
    AddLabel(this,&local_d8);
    _Var3._M_p = local_d8._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar4) {
    operator_delete(_Var3._M_p);
  }
  this->lastVisited = this->lastVisited + 1;
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_98);
  if (local_30.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CPrintVisitor::Visit(CMethod &stm) {
	std::vector<INode*> children = { stm.returnType.get(), stm.returnExp.get(), stm.arguments.get(), stm.vars.get(), stm.statements.get() };
	ChildrenAnswers answers = VisitChildren(children);

	AddChildrenAnswers(answers);
	if (stm.isPublic) {
		AddLabel("PublicMethod");
	} else {
		AddLabel("PrivateMethod");
	}
	++lastVisited;
}